

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool vkb::detail::check_layers_supported
               (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *available_layers,
               vector<const_char_*,_std::allocator<const_char_*>_> *layer_names)

{
  pointer ppcVar1;
  bool bVar2;
  bool bVar3;
  char **layer_name;
  pointer ppcVar4;
  
  ppcVar1 = (layer_names->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (ppcVar4 = (layer_names->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1; ppcVar4 = ppcVar4 + 1
      ) {
    bVar2 = check_layer_supported(available_layers,*ppcVar4);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool check_layers_supported(std::vector<VkLayerProperties> const& available_layers, std::vector<const char*> const& layer_names) {
    bool all_found = true;
    for (const auto& layer_name : layer_names) {
        bool found = check_layer_supported(available_layers, layer_name);
        if (!found) all_found = false;
    }
    return all_found;
}